

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O2

void Sfm_TranslateCnf(Vec_Wec_t *vRes,Vec_Str_t *vCnf,Vec_Int_t *vFaninMap,int iPivotVar)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int i;
  int iVar7;
  uint uVar8;
  
  for (iVar7 = 0; iVar7 < vRes->nSize; iVar7 = iVar7 + 1) {
    pVVar5 = Vec_WecEntry(vRes,iVar7);
    pVVar5->nSize = 0;
  }
  vRes->nSize = 0;
  pVVar5 = Vec_WecPushLevel(vRes);
  iVar7 = 0;
  do {
    if (vCnf->nSize <= iVar7) {
      return;
    }
    bVar1 = Vec_StrEntry(vCnf,iVar7);
    if (bVar1 == 0xff) {
      pVVar5 = Vec_WecPushLevel(vRes);
    }
    else {
      if ((char)bVar1 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x134,"int Abc_Lit2LitV(int *, int)");
      }
      piVar6 = vFaninMap->pArray;
      uVar2 = Abc_Lit2Var((uint)bVar1);
      iVar4 = piVar6[uVar2];
      iVar3 = Abc_LitIsCompl((uint)bVar1);
      uVar2 = Abc_Var2Lit(iVar4,iVar3);
      iVar3 = Abc_Lit2Var(uVar2);
      iVar4 = pVVar5->nSize;
      if (iVar4 == pVVar5->nCap) {
        uVar8 = iVar4 * 2;
        if (iVar4 < 0x10) {
          uVar8 = 0x10;
        }
        if (iVar4 < (int)uVar8) {
          if (pVVar5->pArray == (int *)0x0) {
            piVar6 = (int *)malloc((ulong)uVar8 << 2);
          }
          else {
            piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar8 << 2);
          }
          pVVar5->pArray = piVar6;
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar5->nCap = uVar8;
          iVar4 = pVVar5->nSize;
        }
      }
      pVVar5->nSize = iVar4 + 1;
      pVVar5->pArray[iVar4] = uVar2 ^ iVar3 == iPivotVar;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Sfm_TranslateCnf( Vec_Wec_t * vRes, Vec_Str_t * vCnf, Vec_Int_t * vFaninMap, int iPivotVar )
{
    Vec_Int_t * vClause;
    signed char Entry;
    int i, Lit;
    Vec_WecClear( vRes );
    vClause = Vec_WecPushLevel( vRes );
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            vClause = Vec_WecPushLevel( vRes );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vFaninMap), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vClause, Lit );
    }
}